

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

instrStruct * getInstruction(int pos)

{
  int local_1c;
  instrStruct *piStack_18;
  int i;
  instrStruct *element;
  int pos_local;
  
  local_1c = 0;
  piStack_18 = firstInstr->next;
  for (; local_1c < pos; local_1c = local_1c + 1) {
    piStack_18 = piStack_18->next;
  }
  return piStack_18;
}

Assistant:

instrStruct *getInstruction(int pos) {
	variable struct instrStruct *element;
	variable int i;
	i=0;
	element = firstInstr->next;
	while (i < pos) {
		element = element->next;
		i = i + 1;
	}
	return element;
}